

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O1

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  size_t __len;
  long offset;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  mode_t mVar5;
  int iVar6;
  wchar_t wVar7;
  char *pcVar8;
  la_int64_t lVar9;
  char *pcVar10;
  ulong uVar12;
  __off_t _Var13;
  __off_t __offset;
  int *piVar14;
  char cVar15;
  ulong uVar16;
  long lVar17;
  byte *pbVar18;
  stat s;
  int stflags;
  int local_10e4;
  int local_10e0;
  int local_10dc;
  ulong local_10d8;
  ulong local_10d0;
  stat local_10c8;
  long local_1038 [2];
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  byte local_ff0 [4032];
  ssize_t sVar11;
  
  local_10e4 = fd;
  iVar3 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_entry_from_file");
  if (iVar3 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  pcVar8 = archive_entry_sourcepath(entry);
  if (pcVar8 == (char *)0x0) {
    pcVar8 = archive_entry_pathname(entry);
  }
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat *)0x0) {
      if (local_10e4 < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          st = &local_10c8;
          iVar3 = lstat(pcVar8,(stat *)st);
          if (iVar3 != 0) {
            piVar14 = __errno_location();
            iVar3 = *piVar14;
            pcVar10 = "Can\'t lstat %s";
            goto LAB_006227f2;
          }
        }
        else {
          st = &local_10c8;
          iVar3 = stat(pcVar8,(stat *)st);
          if (iVar3 != 0) {
            piVar14 = __errno_location();
            iVar3 = *piVar14;
            pcVar10 = "Can\'t stat %s";
LAB_006227f2:
            archive_set_error(_a,iVar3,pcVar10,pcVar8);
            return -0x19;
          }
        }
      }
      else {
        st = &local_10c8;
        iVar3 = fstat(local_10e4,(stat *)st);
        if (iVar3 != 0) {
          piVar14 = __errno_location();
          archive_set_error(_a,*piVar14,"Can\'t fstat");
          return -0x19;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  lVar9 = archive_entry_uid(entry);
  pcVar10 = archive_read_disk_uname(_a,lVar9);
  if (pcVar10 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar10);
  }
  lVar9 = archive_entry_gid(entry);
  pcVar10 = archive_read_disk_gname(_a,lVar9);
  if (pcVar10 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar10);
  }
  if ((((ulong)_a[1].error_string.s & 0x40) == 0) && ((st->st_mode & 0xf000) == 0x4000)) {
    if (local_10e4 < 0) {
      if (*(long *)&_a[1].archive_format == 0) {
        local_10e4 = open(pcVar8,0x80800);
      }
      else {
        local_10e4 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar8,0x80800);
      }
      __archive_ensure_cloexec_flag(local_10e4);
    }
    if (-1 < local_10e4) {
      iVar3 = ioctl(local_10e4,0x80086601,local_1038);
      if ((int)local_1038[0] != 0 && iVar3 == 0) {
        archive_entry_set_fflags(entry,(long)(int)local_1038[0],0);
      }
    }
  }
  if ((st->st_mode & 0xf000) == 0xa000) {
    __len = st->st_size;
    pcVar10 = (char *)malloc(__len + 1);
    if (pcVar10 == (char *)0x0) {
      archive_set_error(_a,0xc,"Couldn\'t read link data");
LAB_0062276b:
      bVar1 = false;
      iVar3 = -0x19;
    }
    else {
      if (*(long *)&_a[1].archive_format == 0) {
        sVar11 = readlink(pcVar8,pcVar10,__len);
        uVar4 = (uint)sVar11;
      }
      else {
        iVar3 = (**(code **)&_a[1].file_count)();
        sVar11 = readlinkat(iVar3,pcVar8,pcVar10,__len);
        uVar4 = (uint)sVar11;
      }
      if ((int)uVar4 < 0) {
        piVar14 = __errno_location();
        archive_set_error(_a,*piVar14,"Couldn\'t read link data");
        free(pcVar10);
        goto LAB_0062276b;
      }
      pcVar10[uVar4 & 0x7fffffff] = '\0';
      archive_entry_set_symlink(entry,pcVar10);
      free(pcVar10);
      iVar3 = -0x1e;
      bVar1 = true;
    }
    if (!bVar1) {
      return iVar3;
    }
  }
  iVar3 = 0;
  if ((((((ulong)_a[1].error_string.s & 0x80) != 0) ||
       (mVar5 = archive_entry_filetype(entry), mVar5 != 0x8000)) ||
      (lVar9 = archive_entry_size(entry), iVar3 = 0, lVar9 < 1)) ||
     (pcVar8 = archive_entry_hardlink(entry), pcVar8 != (char *)0x0)) goto LAB_00622b6c;
  if (local_10e4 < 0) {
    pcVar8 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10e4);
  }
  else {
    pcVar8 = (char *)0x0;
  }
  if (local_10e4 < 0) {
    iVar3 = -0x19;
    if (pcVar8 == (char *)0x0) goto LAB_00622b6c;
    local_10e4 = open(pcVar8,0x80800);
    if (-1 < local_10e4) {
      __archive_ensure_cloexec_flag(local_10e4);
      uVar16 = 0;
      goto LAB_00622882;
    }
LAB_00622c2a:
    iVar3 = -0x19;
    piVar14 = __errno_location();
    archive_set_error(_a,*piVar14,"Can\'t open `%s\'",pcVar8);
  }
  else {
    uVar12 = lseek(local_10e4,0,1);
    uVar16 = 0;
    if (uVar12 != 0) {
      lseek(local_10e4,0,0);
      uVar16 = uVar12;
    }
LAB_00622882:
    iVar3 = 0;
    _Var13 = lseek(local_10e4,0,4);
    if (-1 < _Var13) {
      if (_Var13 != 0) {
        lseek(local_10e4,0,0);
      }
      local_10e0 = fd;
      local_10d8 = uVar16;
      lVar9 = archive_entry_size(entry);
      if (lVar9 < 1) {
LAB_00622b0a:
        iVar3 = 0;
      }
      else {
        _Var13 = 0;
        while (__offset = lseek(local_10e4,_Var13,3), __offset != -1) {
          _Var13 = lseek(local_10e4,__offset,4);
          if (_Var13 == -1) {
            piVar14 = __errno_location();
            if (*piVar14 == 6) {
              iVar3 = 0;
              _Var13 = lseek(local_10e4,0,2);
              if (_Var13 != -1) goto LAB_00622b58;
            }
            iVar3 = *piVar14;
            pcVar8 = "lseek(SEEK_DATA) failed";
            goto LAB_00622b48;
          }
          iVar3 = 0;
          if ((_Var13 == lVar9 && __offset == 0) ||
             (archive_entry_sparse_add_entry(entry,__offset,_Var13 - __offset), lVar9 <= _Var13))
          goto LAB_00622b58;
        }
        piVar14 = __errno_location();
        iVar3 = *piVar14;
        if (iVar3 == 6) {
          wVar7 = archive_entry_sparse_count(entry);
          if (wVar7 != L'\0') goto LAB_00622b0a;
          iVar3 = 0;
          _Var13 = lseek(local_10e4,0,4);
          if (_Var13 == 0) {
            iVar3 = 0;
            _Var13 = lseek(local_10e4,0,2);
            if (_Var13 == lVar9) {
              iVar3 = 0;
              archive_entry_sparse_add_entry(entry,0,0);
            }
          }
        }
        else {
          pcVar8 = "lseek(SEEK_HOLE) failed";
LAB_00622b48:
          archive_set_error(_a,iVar3,pcVar8);
          iVar3 = -0x19;
        }
      }
LAB_00622b58:
      lseek(local_10e4,local_10d8,0);
      fd = local_10e0;
      goto LAB_00622b6c;
    }
    mVar5 = archive_entry_filetype(entry);
    if (((mVar5 != 0x8000) || (lVar9 = archive_entry_size(entry), lVar9 < 1)) ||
       (pcVar8 = archive_entry_hardlink(entry), pcVar8 != (char *)0x0)) goto LAB_00622b6c;
    if (local_10e4 < 0) {
      pcVar8 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,(int *)0x0);
      iVar3 = -0x19;
      if (pcVar8 == (char *)0x0) goto LAB_00622b6c;
      if (*(long *)&_a[1].archive_format == 0) {
        local_10e4 = open(pcVar8,0x80800);
      }
      else {
        local_10e4 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar8,0x80800);
      }
      if (local_10e4 < 0) goto LAB_00622c2a;
      __archive_ensure_cloexec_flag(local_10e4);
    }
    memset(local_1038,0,0x1000);
    local_1038[1] = 0xffffffffffffffff;
    local_1028 = 1;
    local_1020 = 0x48;
    local_10d8 = archive_entry_size(entry);
    bVar1 = true;
    uVar16 = 0xc020660b;
    local_10dc = 0;
    local_10d0 = 0xc020660b;
    do {
      iVar3 = 0;
      iVar6 = ioctl(local_10e4,uVar16,local_1038);
      if (iVar6 < 0) {
LAB_00622adc:
        bVar2 = false;
      }
      else if (local_1024 == 0) {
        if (local_10dc != 0) goto LAB_00622adc;
        bVar2 = false;
        archive_entry_sparse_add_entry(entry,0,0);
      }
      else {
        if (0 < (int)local_1024) {
          iVar6 = 0;
          pbVar18 = local_ff0;
          do {
            if ((pbVar18[1] & 8) == 0) {
              offset = *(long *)(pbVar18 + -0x28);
              uVar16 = offset + *(long *)(pbVar18 + -0x18);
              lVar17 = 0;
              if (local_10d8 <= uVar16) {
                lVar17 = uVar16 - local_10d8;
              }
              uVar16 = *(long *)(pbVar18 + -0x18) - lVar17;
              cVar15 = uVar16 != local_10d8 || offset != 0;
              bVar2 = false;
              if ((uVar16 != local_10d8 || offset != 0) && (bVar2 = bVar1, 0 < (long)uVar16)) {
                local_10e0 = CONCAT31(local_10e0._1_3_,cVar15);
                archive_entry_sparse_add_entry(entry,offset,uVar16);
                cVar15 = (char)local_10e0;
              }
              bVar1 = bVar2;
              if (cVar15 == '\0') break;
            }
            if ((*pbVar18 & 1) != 0) {
              bVar1 = false;
            }
            iVar6 = iVar6 + 1;
            pbVar18 = pbVar18 + 0x38;
          } while (iVar6 < (int)local_1024);
        }
        uVar16 = local_10d0;
        if (!bVar1) {
          bVar1 = false;
          goto LAB_00622adc;
        }
        local_1038[0] =
             local_1038[(ulong)local_1024 * 7 + -1] +
             local_10c8.__glibc_reserved[(ulong)local_1024 * 7];
        bVar2 = true;
        bVar1 = true;
      }
      local_10dc = local_10dc + 1;
    } while (bVar2);
  }
LAB_00622b6c:
  if (local_10e4 != fd) {
    close(local_10e4);
  }
  return iVar3;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC, ARCHIVE_STATE_ANY,
		"archive_read_disk_entry_from_file");

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (la_stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 && st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS)) || \
    (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS))
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 &&
	    (S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd,
#if defined(FS_IOC_GETFLAGS)
			    FS_IOC_GETFLAGS,
#else
			    EXT2_IOC_GETFLAGS,
#endif
			    &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len + 1);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = '\0';
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = 0;
	if ((a->flags & ARCHIVE_READDISK_NO_ACL) == 0)
		r = archive_read_disk_entry_setup_acls(a, entry, &fd);
	if ((a->flags & ARCHIVE_READDISK_NO_XATTR) == 0) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->flags & ARCHIVE_READDISK_MAC_COPYFILE) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if ((a->flags & ARCHIVE_READDISK_NO_SPARSE) == 0) {
		r1 = setup_sparse(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}